

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::CommonFunctionCase::~CommonFunctionCase(CommonFunctionCase *this)

{
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CommonFunctionCase_01e4c000;
  deinit(this);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_failMsg);
  deqp::gls::ShaderExecUtil::ShaderSpec::~ShaderSpec(&this->m_spec);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

CommonFunctionCase::~CommonFunctionCase (void)
{
	CommonFunctionCase::deinit();
}